

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Tracks::ParseTrackEntry
          (Tracks *this,longlong track_start,longlong track_size,longlong element_start,
          longlong element_size,Track **pResult)

{
  AudioTrack **ppAVar1;
  int iVar2;
  long lVar3;
  unsigned_long_long uVar4;
  Info *pIVar5;
  Track *pTVar6;
  long in_RDX;
  VideoTrack **in_RSI;
  Info *in_RDI;
  long *in_R9;
  long status_9;
  Track *pTrack_2;
  long status_8;
  AudioTrack *pTrack_1;
  long status_7;
  VideoTrack *pTrack;
  long status_6;
  int status_5;
  uchar *buf;
  size_t buflen;
  long status_4;
  longlong duration;
  long status_3;
  long status_2;
  longlong type;
  longlong num;
  int status_1;
  uchar b;
  longlong pos_end;
  longlong pos_;
  longlong start;
  long status;
  longlong size;
  longlong id;
  longlong lacing;
  Settings e;
  Settings a;
  Settings v;
  Info info;
  longlong track_stop;
  longlong pos;
  IMkvReader *pReader;
  longlong *in_stack_fffffffffffffd98;
  longlong *in_stack_fffffffffffffda0;
  unsigned_long_long in_stack_fffffffffffffda8;
  char **in_stack_fffffffffffffdb0;
  Tracks *in_stack_fffffffffffffdb8;
  longlong in_stack_fffffffffffffdc0;
  IMkvReader *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  Info *in_stack_fffffffffffffdd8;
  Info *in_stack_fffffffffffffde0;
  Segment *in_stack_fffffffffffffde8;
  AudioTrack **in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  Segment *in_stack_fffffffffffffe28;
  Segment *in_stack_fffffffffffffe38;
  byte local_141;
  VideoTrack **local_140;
  VideoTrack **in_stack_fffffffffffffec8;
  VideoTrack **in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  Info *in_stack_fffffffffffffee0;
  Segment *in_stack_fffffffffffffee8;
  size_t local_110;
  long local_108;
  Segment *local_100;
  VideoTrack **local_f8;
  VideoTrack **local_e8;
  size_t sStack_e0;
  VideoTrack **local_d8;
  size_t sStack_d0;
  Info local_c8;
  VideoTrack **local_50;
  VideoTrack **local_48;
  undefined8 *local_40;
  long *local_38;
  Segment *local_8;
  
  if (*in_R9 != 0) {
    return -1;
  }
  local_40 = *(undefined8 **)in_RDI->type;
  local_50 = (VideoTrack **)((long)in_RSI + in_RDX);
  local_48 = in_RSI;
  local_38 = in_R9;
  Track::Info::Info(&local_c8);
  local_c8.type = 0;
  local_c8.number = 0;
  local_c8.uid = 0;
  local_c8.defaultDuration = 0;
  local_d8 = (VideoTrack **)0xffffffffffffffff;
  sStack_d0 = 0xffffffffffffffff;
  local_e8 = (VideoTrack **)0xffffffffffffffff;
  sStack_e0 = 0xffffffffffffffff;
  local_f8 = (VideoTrack **)0xffffffffffffffff;
  local_100 = (Segment *)0x1;
LAB_001854e5:
  if ((long)local_50 <= (long)local_48) {
    if (local_48 != local_50) {
      local_8 = (Segment *)0xfffffffffffffffe;
      goto LAB_00186239;
    }
    if (local_c8.number < 1) {
      local_8 = (Segment *)0xfffffffffffffffe;
      goto LAB_00186239;
    }
    pTVar6 = GetTrackByNumber(in_stack_fffffffffffffdb8,(long)in_stack_fffffffffffffdb0);
    if (pTVar6 != (Track *)0x0) {
      local_8 = (Segment *)0xfffffffffffffffe;
      goto LAB_00186239;
    }
    if (local_c8.type < 1) {
      local_8 = (Segment *)0xfffffffffffffffe;
      goto LAB_00186239;
    }
    local_c8.lacing = (bool)(-(0 < (long)local_100) & 1);
    if (local_c8.type == 1) {
      if ((long)local_d8 < 0) {
        local_8 = (Segment *)0xfffffffffffffffe;
        goto LAB_00186239;
      }
      if (-1 < (long)local_e8) {
        local_8 = (Segment *)0xfffffffffffffffe;
        goto LAB_00186239;
      }
      local_c8.settings.start = (longlong)local_d8;
      local_c8.settings.size = sStack_d0;
      local_8 = (Segment *)
                VideoTrack::Parse(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                  (longlong)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      if (local_8 != (Segment *)0x0) goto LAB_00186239;
      *local_38 = 0;
      if (-1 < (long)local_f8) {
        Track::ParseContentEncodingsEntry
                  ((Track *)in_stack_fffffffffffffe28,
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (longlong)in_stack_fffffffffffffe18);
      }
    }
    else if (local_c8.type == 2) {
      if ((long)local_e8 < 0) {
        local_8 = (Segment *)0xfffffffffffffffe;
        goto LAB_00186239;
      }
      if (-1 < (long)local_d8) {
        local_8 = (Segment *)0xfffffffffffffffe;
        goto LAB_00186239;
      }
      local_c8.settings.start = (longlong)local_e8;
      local_c8.settings.size = sStack_e0;
      local_8 = (Segment *)
                AudioTrack::Parse(in_stack_fffffffffffffe38,in_RDI,
                                  (longlong)in_stack_fffffffffffffe28,
                                  CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                                  in_stack_fffffffffffffe18);
      if (local_8 != (Segment *)0x0) goto LAB_00186239;
      *local_38 = 0;
      if (-1 < (long)local_f8) {
        Track::ParseContentEncodingsEntry
                  ((Track *)in_stack_fffffffffffffe28,
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (longlong)in_stack_fffffffffffffe18);
      }
    }
    else {
      if (-1 < (long)local_e8) {
        local_8 = (Segment *)0xfffffffffffffffe;
        goto LAB_00186239;
      }
      if (-1 < (long)local_d8) {
        local_8 = (Segment *)0xfffffffffffffffe;
        goto LAB_00186239;
      }
      if ((local_c8.type == 0x21) && (-1 < (long)local_f8)) {
        local_8 = (Segment *)0xfffffffffffffffe;
        goto LAB_00186239;
      }
      local_c8.settings.start = -1;
      local_c8.settings.size = 0;
      local_8 = (Segment *)
                Track::Create(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                              (longlong)in_stack_fffffffffffffdd8,
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                              (Track **)in_stack_fffffffffffffdc8);
      if (local_8 != (Segment *)0x0) goto LAB_00186239;
      *local_38 = 0;
    }
    local_8 = (Segment *)0x0;
    goto LAB_00186239;
  }
  in_stack_fffffffffffffe28 =
       (Segment *)
       ParseElementHeader((IMkvReader *)in_stack_fffffffffffffdb8,
                          (longlong *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                          in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  local_8 = in_stack_fffffffffffffe28;
  if ((long)in_stack_fffffffffffffe28 < 0) goto LAB_00186239;
  if ((long)local_110 < 0) {
    local_8 = (Segment *)0xfffffffffffffffe;
    goto LAB_00186239;
  }
  in_stack_fffffffffffffed0 = local_48;
  in_stack_fffffffffffffee8 = in_stack_fffffffffffffe28;
  lVar3 = local_c8.type;
  ppAVar1 = (AudioTrack **)local_c8.number;
  uVar4 = local_c8.defaultDuration;
  if (local_108 == 0xe0) {
    local_d8 = local_48;
    sStack_d0 = local_110;
  }
  else if (local_108 == 0xe1) {
    local_e8 = local_48;
    sStack_e0 = local_110;
  }
  else if (local_108 == 0x6d80) {
    local_f8 = local_48;
  }
  else if (local_108 == 0x73c5) {
    if (8 < (long)local_110) {
      local_8 = (Segment *)0xfffffffffffffffe;
      goto LAB_00186239;
    }
    local_c8.uid = 0;
    local_140 = (VideoTrack **)((long)local_48 + local_110);
    for (in_stack_fffffffffffffec8 = local_48; lVar3 = local_c8.type,
        ppAVar1 = (AudioTrack **)local_c8.number, uVar4 = local_c8.defaultDuration,
        in_stack_fffffffffffffec8 != local_140;
        in_stack_fffffffffffffec8 = (VideoTrack **)((long)in_stack_fffffffffffffec8 + 1)) {
      iVar2 = (**(code **)*local_40)(local_40,in_stack_fffffffffffffec8,1,&local_141);
      if (iVar2 != 0) {
        local_8 = (Segment *)(long)iVar2;
        goto LAB_00186239;
      }
      local_c8.uid = (ulong)local_141 | local_c8.uid << 8;
      in_stack_fffffffffffffe24 = 0;
    }
  }
  else if (local_108 == 0xd7) {
    in_stack_fffffffffffffe18 =
         (AudioTrack **)
         UnserializeUInt((IMkvReader *)in_stack_fffffffffffffdb8,(longlong)in_stack_fffffffffffffdb0
                         ,in_stack_fffffffffffffda8);
    if (((long)in_stack_fffffffffffffe18 < 1) ||
       (lVar3 = local_c8.type, ppAVar1 = in_stack_fffffffffffffe18, uVar4 = local_c8.defaultDuration
       , 0x7f < (long)in_stack_fffffffffffffe18)) {
      local_8 = (Segment *)0xfffffffffffffffe;
      goto LAB_00186239;
    }
  }
  else if (local_108 == 0x83) {
    lVar3 = UnserializeUInt((IMkvReader *)in_stack_fffffffffffffdb8,
                            (longlong)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    if ((lVar3 < 1) ||
       (ppAVar1 = (AudioTrack **)local_c8.number, uVar4 = local_c8.defaultDuration, 0xfe < lVar3)) {
      local_8 = (Segment *)0xfffffffffffffffe;
      goto LAB_00186239;
    }
  }
  else {
    if (local_108 == 0x536e) {
      local_8 = (Segment *)
                UnserializeString(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                                  (longlong)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    }
    else {
      if (local_108 != 0x22b59c) {
        if (local_108 == 0x23e383) {
          uVar4 = UnserializeUInt((IMkvReader *)in_stack_fffffffffffffdb8,
                                  (longlong)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
          lVar3 = local_c8.type;
          ppAVar1 = (AudioTrack **)local_c8.number;
          if ((long)uVar4 < 0) {
            local_8 = (Segment *)0xfffffffffffffffe;
            goto LAB_00186239;
          }
        }
        else {
          if (local_108 == 0x86) {
            local_8 = (Segment *)
                      UnserializeString(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                                        (longlong)in_stack_fffffffffffffdb8,
                                        in_stack_fffffffffffffdb0);
            goto joined_r0x00185a74;
          }
          if (local_108 == 0x9c) {
            in_stack_fffffffffffffde8 =
                 (Segment *)
                 UnserializeUInt((IMkvReader *)in_stack_fffffffffffffdb8,
                                 (longlong)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
            if (((long)in_stack_fffffffffffffde8 < 0) ||
               (local_100 = in_stack_fffffffffffffde8, lVar3 = local_c8.type,
               ppAVar1 = (AudioTrack **)local_c8.number, uVar4 = local_c8.defaultDuration,
               1 < (long)in_stack_fffffffffffffde8)) {
              local_8 = (Segment *)0xfffffffffffffffe;
              goto LAB_00186239;
            }
          }
          else if (local_108 == 0x63a2) {
            in_stack_fffffffffffffde0 = (Info *)local_c8.codecPrivate;
            if ((Info *)local_c8.codecPrivate != (Info *)0x0) {
              operator_delete__(local_c8.codecPrivate);
              in_stack_fffffffffffffde0 = (Info *)local_c8.codecPrivate;
            }
            local_c8.codecPrivate = (uchar *)0x0;
            local_c8.codecPrivateSize = 0;
            lVar3 = local_c8.type;
            ppAVar1 = (AudioTrack **)local_c8.number;
            uVar4 = local_c8.defaultDuration;
            if (local_110 == 0) goto LAB_00185d7c;
            pIVar5 = (Info *)SafeArrayAlloc<unsigned_char>
                                       (in_stack_fffffffffffffda8,
                                        (unsigned_long_long)in_stack_fffffffffffffda0);
            if (pIVar5 == (Info *)0x0) {
              local_8 = (Segment *)0xffffffffffffffff;
              goto LAB_00186239;
            }
            in_stack_fffffffffffffdd8 = pIVar5;
            iVar2 = (**(code **)*local_40)(local_40,local_48,local_110,pIVar5);
            if (iVar2 != 0) {
              if (pIVar5 != (Info *)0x0) {
                operator_delete__(pIVar5);
              }
              local_8 = (Segment *)(long)iVar2;
              goto LAB_00186239;
            }
            local_c8.codecPrivateSize = local_110;
            in_stack_fffffffffffffdd4 = 0;
            lVar3 = local_c8.type;
            ppAVar1 = (AudioTrack **)local_c8.number;
            uVar4 = local_c8.defaultDuration;
            local_c8.codecPrivate = (uchar *)pIVar5;
          }
          else if (local_108 == 0x258688) {
            local_8 = (Segment *)
                      UnserializeString(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                                        (longlong)in_stack_fffffffffffffdb8,
                                        in_stack_fffffffffffffdb0);
            if (local_8 != (Segment *)0x0) goto LAB_00186239;
            in_stack_fffffffffffffdc0 = 0;
            lVar3 = local_c8.type;
            ppAVar1 = (AudioTrack **)local_c8.number;
            uVar4 = local_c8.defaultDuration;
          }
          else if (local_108 == 0x56aa) {
            in_stack_fffffffffffffdb8 =
                 (Tracks *)
                 UnserializeUInt((IMkvReader *)in_stack_fffffffffffffdb8,
                                 (longlong)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
            lVar3 = local_c8.type;
            ppAVar1 = (AudioTrack **)local_c8.number;
            uVar4 = local_c8.defaultDuration;
            local_c8.codecDelay = (unsigned_long_long)in_stack_fffffffffffffdb8;
          }
          else if (local_108 == 0x56bb) {
            in_stack_fffffffffffffdb0 =
                 (char **)UnserializeUInt((IMkvReader *)in_stack_fffffffffffffdb8,
                                          (longlong)in_stack_fffffffffffffdb0,
                                          in_stack_fffffffffffffda8);
            lVar3 = local_c8.type;
            ppAVar1 = (AudioTrack **)local_c8.number;
            uVar4 = local_c8.defaultDuration;
            local_c8.seekPreRoll = (unsigned_long_long)in_stack_fffffffffffffdb0;
          }
        }
        goto LAB_00185d7c;
      }
      local_8 = (Segment *)
                UnserializeString(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                                  (longlong)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    }
joined_r0x00185a74:
    lVar3 = local_c8.type;
    ppAVar1 = (AudioTrack **)local_c8.number;
    uVar4 = local_c8.defaultDuration;
    if (local_8 != (Segment *)0x0) goto LAB_00186239;
  }
LAB_00185d7c:
  local_c8.defaultDuration = uVar4;
  local_c8.number = (long)ppAVar1;
  local_c8.type = lVar3;
  local_48 = (VideoTrack **)(local_110 + (long)local_48);
  if ((long)local_50 < (long)local_48) {
    local_8 = (Segment *)0xfffffffffffffffe;
LAB_00186239:
    Track::Info::~Info((Info *)0x186246);
    return (long)local_8;
  }
  goto LAB_001854e5;
}

Assistant:

long Tracks::ParseTrackEntry(long long track_start, long long track_size,
                             long long element_start, long long element_size,
                             Track*& pResult) const {
  if (pResult)
    return -1;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = track_start;
  const long long track_stop = track_start + track_size;

  Track::Info info;

  info.type = 0;
  info.number = 0;
  info.uid = 0;
  info.defaultDuration = 0;

  Track::Settings v;
  v.start = -1;
  v.size = -1;

  Track::Settings a;
  a.start = -1;
  a.size = -1;

  Track::Settings e;  // content_encodings_settings;
  e.start = -1;
  e.size = -1;

  long long lacing = 1;  // default is true

  while (pos < track_stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, track_stop, id, size);

    if (status < 0)  // error
      return status;

    if (size < 0)
      return E_FILE_FORMAT_INVALID;

    const long long start = pos;

    if (id == libwebm::kMkvVideo) {
      v.start = start;
      v.size = size;
    } else if (id == libwebm::kMkvAudio) {
      a.start = start;
      a.size = size;
    } else if (id == libwebm::kMkvContentEncodings) {
      e.start = start;
      e.size = size;
    } else if (id == libwebm::kMkvTrackUID) {
      if (size > 8)
        return E_FILE_FORMAT_INVALID;

      info.uid = 0;

      long long pos_ = start;
      const long long pos_end = start + size;

      while (pos_ != pos_end) {
        unsigned char b;

        const int status = pReader->Read(pos_, 1, &b);

        if (status)
          return status;

        info.uid <<= 8;
        info.uid |= b;

        ++pos_;
      }
    } else if (id == libwebm::kMkvTrackNumber) {
      const long long num = UnserializeUInt(pReader, pos, size);

      if ((num <= 0) || (num > 127))
        return E_FILE_FORMAT_INVALID;

      info.number = static_cast<long>(num);
    } else if (id == libwebm::kMkvTrackType) {
      const long long type = UnserializeUInt(pReader, pos, size);

      if ((type <= 0) || (type > 254))
        return E_FILE_FORMAT_INVALID;

      info.type = static_cast<long>(type);
    } else if (id == libwebm::kMkvName) {
      const long status =
          UnserializeString(pReader, pos, size, info.nameAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvLanguage) {
      const long status = UnserializeString(pReader, pos, size, info.language);

      if (status)
        return status;
    } else if (id == libwebm::kMkvDefaultDuration) {
      const long long duration = UnserializeUInt(pReader, pos, size);

      if (duration < 0)
        return E_FILE_FORMAT_INVALID;

      info.defaultDuration = static_cast<unsigned long long>(duration);
    } else if (id == libwebm::kMkvCodecID) {
      const long status = UnserializeString(pReader, pos, size, info.codecId);

      if (status)
        return status;
    } else if (id == libwebm::kMkvFlagLacing) {
      lacing = UnserializeUInt(pReader, pos, size);

      if ((lacing < 0) || (lacing > 1))
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvCodecPrivate) {
      delete[] info.codecPrivate;
      info.codecPrivate = NULL;
      info.codecPrivateSize = 0;

      const size_t buflen = static_cast<size_t>(size);

      if (buflen) {
        unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);

        if (buf == NULL)
          return -1;

        const int status = pReader->Read(pos, static_cast<long>(buflen), buf);

        if (status) {
          delete[] buf;
          return status;
        }

        info.codecPrivate = buf;
        info.codecPrivateSize = buflen;
      }
    } else if (id == libwebm::kMkvCodecName) {
      const long status =
          UnserializeString(pReader, pos, size, info.codecNameAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvCodecDelay) {
      info.codecDelay = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvSeekPreRoll) {
      info.seekPreRoll = UnserializeUInt(pReader, pos, size);
    }

    pos += size;  // consume payload
    if (pos > track_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != track_stop)
    return E_FILE_FORMAT_INVALID;

  if (info.number <= 0)  // not specified
    return E_FILE_FORMAT_INVALID;

  if (GetTrackByNumber(info.number))
    return E_FILE_FORMAT_INVALID;

  if (info.type <= 0)  // not specified
    return E_FILE_FORMAT_INVALID;

  info.lacing = (lacing > 0) ? true : false;

  if (info.type == Track::kVideo) {
    if (v.start < 0)
      return E_FILE_FORMAT_INVALID;

    if (a.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings = v;

    VideoTrack* pTrack = NULL;

    const long status = VideoTrack::Parse(m_pSegment, info, element_start,
                                          element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);

    if (e.start >= 0)
      pResult->ParseContentEncodingsEntry(e.start, e.size);
  } else if (info.type == Track::kAudio) {
    if (a.start < 0)
      return E_FILE_FORMAT_INVALID;

    if (v.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings = a;

    AudioTrack* pTrack = NULL;

    const long status = AudioTrack::Parse(m_pSegment, info, element_start,
                                          element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);

    if (e.start >= 0)
      pResult->ParseContentEncodingsEntry(e.start, e.size);
  } else {
    // neither video nor audio - probably metadata or subtitles

    if (a.start >= 0)
      return E_FILE_FORMAT_INVALID;

    if (v.start >= 0)
      return E_FILE_FORMAT_INVALID;

    if (info.type == Track::kMetadata && e.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings.start = -1;
    info.settings.size = 0;

    Track* pTrack = NULL;

    const long status =
        Track::Create(m_pSegment, info, element_start, element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);
  }

  return 0;  // success
}